

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_policy.cpp
# Opt level: O1

ValuedAction __thiscall
despot::DefaultPolicy::RecursiveValue
          (DefaultPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  pointer *ppiVar1;
  pointer *ppuVar2;
  State *pSVar3;
  DSPOMDP *pDVar4;
  iterator __position;
  bool bVar5;
  uint action;
  int iVar6;
  pointer ppSVar7;
  vector<despot::State*,std::allocator<despot::State*>> *this_00;
  _Rb_tree_node_base *p_Var8;
  _Self __tmp;
  ulong uVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  ValuedAction VVar11;
  State *particle;
  double reward;
  OBS_TYPE obs;
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  partitions;
  double local_a0;
  State *local_88;
  ValuedAction local_80;
  double local_70;
  key_type local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  local_60;
  
  bVar5 = RandomStreams::Exhausted(streams);
  if ((bVar5) ||
     ((ulong)(long)DAT_00193de4 <=
      (ulong)(((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) - (long)this->initial_depth_))) {
    local_80.action =
         (*(this->particle_lower_bound_->super_ScenarioLowerBound)._vptr_ScenarioLowerBound[6])
                   (this->particle_lower_bound_,particles);
    local_80.value = extraout_XMM0_Qa;
  }
  else {
    action = (*(this->super_ScenarioLowerBound)._vptr_ScenarioLowerBound[6])
                       (this,particles,streams,history);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppSVar7 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppSVar7) {
      local_a0 = 0.0;
    }
    else {
      local_a0 = 0.0;
      uVar9 = 0;
      do {
        pSVar3 = ppSVar7[uVar9];
        pDVar4 = (this->super_ScenarioLowerBound).model_;
        local_88 = pSVar3;
        RandomStreams::Entry(streams,pSVar3->scenario_id);
        iVar6 = (*pDVar4->_vptr_DSPOMDP[2])(pDVar4,pSVar3,(ulong)action,&local_70,&local_68);
        dVar10 = local_70 * local_88->weight;
        if ((char)iVar6 == '\0') {
          this_00 = (vector<despot::State*,std::allocator<despot::State*>> *)
                    std::
                    map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                    ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                                  *)&local_60,&local_68);
          __position._M_current = *(State ***)(this_00 + 8);
          if (__position._M_current == *(State ***)(this_00 + 0x10)) {
            std::vector<despot::State*,std::allocator<despot::State*>>::
            _M_realloc_insert<despot::State*const&>(this_00,__position,&local_88);
          }
          else {
            *__position._M_current = local_88;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        local_a0 = local_a0 + dVar10;
        uVar9 = uVar9 + 1;
        ppSVar7 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(particles->
                                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >>
                              3));
    }
    for (p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      History::Add(history,action,*(OBS_TYPE *)(p_Var8 + 1));
      RandomStreams::Advance(streams);
      VVar11 = RecursiveValue(this,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                                   &p_Var8[1]._M_parent,streams,history);
      dVar10 = DAT_00193de8;
      RandomStreams::Back(streams);
      ppiVar1 = &(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      local_a0 = local_a0 + dVar10 * VVar11.value;
      ppuVar2 = &(history->observations_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
    }
    ValuedAction::ValuedAction(&local_80,action,local_a0);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  VVar11._4_4_ = 0;
  VVar11.action = local_80.action;
  VVar11.value = local_80.value;
  return VVar11;
}

Assistant:

ValuedAction DefaultPolicy::RecursiveValue(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	if (streams.Exhausted()
		|| (history.Size() - initial_depth_
			>= Globals::config.max_policy_sim_len)) {
		return particle_lower_bound_->Value(particles);
	} else {
		ACT_TYPE action = Action(particles, streams, history);

		double value = 0;

		map<OBS_TYPE, vector<State*> > partitions;
		OBS_TYPE obs;
		double reward;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			bool terminal = model_->Step(*particle,
				streams.Entry(particle->scenario_id), action, reward, obs);

			value += reward * particle->weight;

			if (!terminal) {
				partitions[obs].push_back(particle);
			}
		}

		for (map<OBS_TYPE, vector<State*> >::iterator it = partitions.begin();
			it != partitions.end(); it++) {
			OBS_TYPE obs = it->first;
			history.Add(action, obs);
			streams.Advance();
			ValuedAction va = RecursiveValue(it->second, streams, history);
			value += Globals::Discount() * va.value;
			streams.Back();
			history.RemoveLast();
		}

		return ValuedAction(action, value);
	}
}